

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::segment::Atlas::Atlas(Atlas *this)

{
  Atlas *this_local;
  
  Array<float>::Array(&this->m_edgeLengths,0xf);
  Array<float>::Array(&this->m_faceAreas,0xf);
  Array<xatlas::internal::Vector3>::Array(&this->m_faceNormals,0xf);
  Array<xatlas::internal::Vector2>::Array(&this->m_texcoords,0xf);
  Array<int>::Array(&this->m_faceCharts,0);
  Array<xatlas::internal::segment::Chart_*>::Array(&this->m_charts,0);
  CostQueue::CostQueue(&this->m_bestTriangles,10);
  KISSRng::KISSRng(&this->m_rand);
  ChartOptions::ChartOptions(&this->m_options);
  Array<unsigned_int>::Array(&this->m_nextPlanarRegionFace,0x10);
  Array<unsigned_int>::Array(&this->m_facePlanarRegionId,0x10);
  Array<xatlas::internal::Vector3>::Array(&this->m_tempPoints,0);
  UniformGrid2::UniformGrid2(&this->m_boundaryGrid);
  Array<float>::Array(&this->m_sharedBoundaryLengths,0);
  Array<float>::Array(&this->m_sharedBoundaryLengthsNoSeams,0);
  Array<unsigned_int>::Array(&this->m_sharedBoundaryEdgeCountNoSeams,0);
  return;
}

Assistant:

Atlas() : m_edgeLengths(MemTag::SegmentAtlasMeshData), m_faceAreas(MemTag::SegmentAtlasMeshData), m_faceNormals(MemTag::SegmentAtlasMeshData), m_texcoords(MemTag::SegmentAtlasMeshData), m_bestTriangles(10), m_nextPlanarRegionFace(MemTag::SegmentAtlasPlanarRegions), m_facePlanarRegionId(MemTag::SegmentAtlasPlanarRegions) {}